

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O0

int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *p)

{
  sat_solver *s;
  int iVar1;
  lit lVar2;
  int local_68;
  uint local_5c;
  int local_58;
  int Mint;
  int b;
  int iVar;
  int nBTLimit;
  int RetValue;
  int Lits [12];
  Mfs_Man_t *p_local;
  
  if ((p->nTotConfLim == 0) || ((p->pSat->stats).conflicts < (long)p->nTotConfLim)) {
    if (p->nTotConfLim == 0) {
      local_68 = 0;
    }
    else {
      local_68 = p->nTotConfLim - (int)(p->pSat->stats).conflicts;
    }
    Lits._40_8_ = p;
    iVar1 = sat_solver_solve(p->pSat,(lit *)0x0,(lit *)0x0,(long)local_68,0,0,0);
    if (((iVar1 != 0) && (iVar1 != 1)) && (iVar1 != -1)) {
      __assert_fail("RetValue == l_Undef || RetValue == l_True || RetValue == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsSat.c"
                    ,0x36,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
    }
    if (iVar1 == 0) {
      p_local._4_4_ = -1;
    }
    else if (iVar1 == -1) {
      p_local._4_4_ = 0;
    }
    else {
      *(int *)(Lits._40_8_ + 0xe8) = *(int *)(Lits._40_8_ + 0xe8) + 1;
      local_5c = 0;
      for (local_58 = 0; iVar1 = Vec_IntSize(*(Vec_Int_t **)(Lits._40_8_ + 0x58)), local_58 < iVar1;
          local_58 = local_58 + 1) {
        iVar1 = Vec_IntEntry(*(Vec_Int_t **)(Lits._40_8_ + 0x58),local_58);
        lVar2 = toLit(iVar1);
        (&nBTLimit)[local_58] = lVar2;
        iVar1 = sat_solver_var_value(*(sat_solver **)(Lits._40_8_ + 0xa8),iVar1);
        if (iVar1 != 0) {
          local_5c = 1 << ((byte)local_58 & 0x1f) | local_5c;
          lVar2 = lit_neg((&nBTLimit)[local_58]);
          (&nBTLimit)[local_58] = lVar2;
        }
      }
      iVar1 = Abc_InfoHasBit((uint *)(Lits._40_8_ + 0xec),local_5c);
      if (iVar1 != 0) {
        __assert_fail("!Abc_InfoHasBit(p->uCare, Mint)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsSat.c"
                      ,0x4b,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
      }
      Abc_InfoSetBit((uint *)(Lits._40_8_ + 0xec),local_5c);
      s = *(sat_solver **)(Lits._40_8_ + 0xa8);
      iVar1 = Vec_IntSize(*(Vec_Int_t **)(Lits._40_8_ + 0x58));
      iVar1 = sat_solver_addclause(s,&nBTLimit,&nBTLimit + iVar1);
      if (iVar1 == 0) {
        p_local._4_4_ = 0;
      }
      else {
        p_local._4_4_ = 1;
      }
    }
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Enumerates through the SAT assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkMfsSolveSat_iter( Mfs_Man_t * p )
{
    int Lits[MFS_FANIN_MAX];
    int RetValue, nBTLimit, iVar, b, Mint;
//    int nConfs = p->pSat->stats.conflicts;
    if ( p->nTotConfLim && p->nTotConfLim <= p->pSat->stats.conflicts )
        return -1;
    nBTLimit = p->nTotConfLim? p->nTotConfLim - p->pSat->stats.conflicts : 0;
    RetValue = sat_solver_solve( p->pSat, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue == l_Undef || RetValue == l_True || RetValue == l_False );
//printf( "%c", RetValue==l_Undef ? '?' : (RetValue==l_False ? '-' : '+') );
//printf( "%d ", p->pSat->stats.conflicts-nConfs );
//if ( RetValue==l_False )
//printf( "\n" );
    if ( RetValue == l_Undef )
        return -1;
    if ( RetValue == l_False )
        return 0;
    p->nCares++;
    // add SAT assignment to the solver
    Mint = 0;
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, b )
    {
        Lits[b] = toLit( iVar );
        if ( sat_solver_var_value( p->pSat, iVar ) )
        {
            Mint |= (1 << b);
            Lits[b] = lit_neg( Lits[b] );
        }
    }
    assert( !Abc_InfoHasBit(p->uCare, Mint) );
    Abc_InfoSetBit( p->uCare, Mint );
    // add the blocking clause
    RetValue = sat_solver_addclause( p->pSat, Lits, Lits + Vec_IntSize(p->vProjVarsSat) );
    if ( RetValue == 0 )
        return 0;
    return 1;
}